

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

DoublePoint ClipperLib::GetUnitNormal(IntPoint *pt1,IntPoint *pt2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double f;
  double dy;
  double dx;
  IntPoint *pt2_local;
  IntPoint *pt1_local;
  
  if ((pt2->X == pt1->X) && (pt2->Y == pt1->Y)) {
    DoublePoint::DoublePoint((DoublePoint *)&pt1_local,0.0,0.0);
  }
  else {
    dVar1 = (double)(pt2->X - pt1->X);
    dVar2 = (double)(pt2->Y - pt1->Y);
    dVar3 = sqrt(dVar1 * dVar1 + dVar2 * dVar2);
    DoublePoint::DoublePoint
              ((DoublePoint *)&pt1_local,(1.0 / dVar3) * dVar2,-((1.0 / dVar3) * dVar1));
  }
  return _pt1_local;
}

Assistant:

DoublePoint GetUnitNormal( const IntPoint &pt1, const IntPoint &pt2)
{
  if(pt2.X == pt1.X && pt2.Y == pt1.Y) 
    return DoublePoint(0, 0);

  double dx = (double)(pt2.X - pt1.X);
  double dy = (double)(pt2.Y - pt1.Y);
  double f = 1 *1.0/ std::sqrt( dx*dx + dy*dy );
  dx *= f;
  dy *= f;
  return DoublePoint(dy, -dx);
}